

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

int commit_stack(Parser *p,SNode *sn)

{
  uint32 *puVar1;
  uint uVar2;
  ZNode *pZVar3;
  PNode *pn;
  int iVar4;
  PNode *pPVar5;
  
  iVar4 = -1;
  if ((sn->zns).n == 1) {
    pZVar3 = *(sn->zns).v;
    uVar2 = (pZVar3->sns).n;
    iVar4 = -2;
    if ((uVar2 < 2) &&
       (((pPVar5 = pZVar3->pn, (pPVar5->parse_node).start_loc.s != (pPVar5->parse_node).end ||
         (pPVar5->reduction == (D_Reduction *)0x0)) ||
        (iVar4 = -3, pPVar5->reduction->final_code == (D_ReductionCode)0x0)))) {
      if (uVar2 == 0) {
        iVar4 = 0;
      }
      else {
        iVar4 = commit_stack(p,*(pZVar3->sns).v);
        if (iVar4 < 0) {
          return iVar4;
        }
      }
      pPVar5 = commit_tree(p,(*(sn->zns).v)->pn);
      if (pPVar5 == (PNode *)0x0) {
        iVar4 = -4;
      }
      else {
        pn = (*(sn->zns).v)->pn;
        if (pPVar5 != pn) {
          pPVar5->refcount = pPVar5->refcount + 1;
          puVar1 = &pn->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            free_PNode(p,pn);
          }
          (*(sn->zns).v)->pn = pPVar5;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int commit_stack(Parser *p, SNode *sn) {
  int res = 0;
  PNode *tpn;

  if (sn->zns.n != 1) return -1;
  if (sn->zns.v[0]->sns.n > 1) return -2;
  if (is_unreduced_epsilon_PNode(sn->zns.v[0]->pn)) /* wait till reduced */
    return -3;
  if (sn->zns.v[0]->sns.n)
    if ((res = commit_stack(p, sn->zns.v[0]->sns.v[0])) < 0) return res;
  tpn = commit_tree(p, sn->zns.v[0]->pn);
  if (!tpn) return -4;
  if (tpn != sn->zns.v[0]->pn) {
    ref_pn(tpn);
    unref_pn(p, sn->zns.v[0]->pn);
    sn->zns.v[0]->pn = tpn;
  }
  return res;
}